

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O2

bool __thiscall cmCTestSVN::InfoParser::ProcessLine(InfoParser *this)

{
  bool bVar1;
  string *psVar2;
  string sStack_38;
  
  psVar2 = &(this->super_LineParser).Line;
  bVar1 = cmsys::RegularExpression::find(&this->RegexRev,psVar2);
  if (bVar1) {
    cmsys::RegularExpression::match_abi_cxx11_(&sStack_38,&this->RegexRev,1);
    psVar2 = this->Rev;
  }
  else {
    bVar1 = cmsys::RegularExpression::find(&this->RegexURL,psVar2);
    if (bVar1) {
      cmsys::RegularExpression::match_abi_cxx11_(&sStack_38,&this->RegexURL,1);
      psVar2 = &this->SVNRepo->URL;
    }
    else {
      bVar1 = cmsys::RegularExpression::find(&this->RegexRoot,psVar2);
      if (!bVar1) {
        return true;
      }
      cmsys::RegularExpression::match_abi_cxx11_(&sStack_38,&this->RegexRoot,1);
      psVar2 = &this->SVNRepo->Root;
    }
  }
  std::__cxx11::string::operator=((string *)psVar2,(string *)&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  return true;
}

Assistant:

bool ProcessLine() CM_OVERRIDE
  {
    if (this->RegexRev.find(this->Line)) {
      this->Rev = this->RegexRev.match(1);
    } else if (this->RegexURL.find(this->Line)) {
      this->SVNRepo.URL = this->RegexURL.match(1);
    } else if (this->RegexRoot.find(this->Line)) {
      this->SVNRepo.Root = this->RegexRoot.match(1);
    }
    return true;
  }